

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VScaleVectorArray(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar6;
  N_Vector *Z;
  N_Vector *Y;
  sunrealtype c [3];
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  double local_38;
  double local_30;
  uint uVar7;
  int iVar8;
  
  iVar8 = 0;
  uVar7 = 0;
  puVar4 = (undefined8 *)N_VCloneVectorArray(3,in_RDI);
  uVar5 = N_VCloneVectorArray(3,in_RDI);
  N_VConst(0x3fe0000000000000,*puVar4);
  local_58 = 0x4000000000000000;
  dVar6 = get_time();
  iVar1 = N_VScaleVectorArray(1,&local_58,puVar4,puVar4);
  sync_device(in_RDI);
  local_30 = get_time();
  if (iVar1 == 0) {
    uVar7 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)((ulong)uVar7 << 0x20),
                      (sunindextype)dVar6);
  }
  else {
    uVar7 = 1;
  }
  if (uVar7 == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n",(ulong)in_EDX);
    iVar8 = iVar8 + 1;
  }
  local_38 = max_time(in_RDI,local_30 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VScaleVectorArray");
  }
  N_VConst(0x3fe0000000000000,*puVar4);
  local_58 = 0x4000000000000000;
  dVar6 = get_time();
  iVar1 = N_VScaleVectorArray(1,&local_58,puVar4,uVar5);
  sync_device(in_RDI);
  local_30 = get_time();
  if (iVar1 == 0) {
    uVar7 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)((ulong)uVar7 << 0x20),
                      (sunindextype)dVar6);
  }
  else {
    uVar7 = 1;
  }
  if (uVar7 == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n",(ulong)in_EDX);
    iVar8 = iVar8 + 1;
  }
  local_38 = max_time(in_RDI,local_30 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VScaleVectorArray");
  }
  N_VConst(0x3fe0000000000000,*puVar4);
  N_VConst(0xc000000000000000,puVar4[1]);
  N_VConst(0xbff0000000000000,puVar4[2]);
  local_58 = 0x4000000000000000;
  local_50 = 0x3fe0000000000000;
  local_48 = 0xc000000000000000;
  dVar6 = get_time();
  iVar1 = N_VScaleVectorArray(3,&local_58,puVar4,puVar4);
  sync_device(in_RDI);
  local_30 = get_time();
  if (iVar1 == 0) {
    iVar2 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)((ulong)uVar7 << 0x20),
                      (sunindextype)dVar6);
    iVar3 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)CONCAT44(iVar2,iVar1),
                      (sunindextype)dVar6);
    iVar3 = iVar3 + iVar2;
    iVar1 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)CONCAT44(iVar3,iVar1),
                      (sunindextype)dVar6);
    uVar7 = iVar1 + iVar3;
  }
  else {
    uVar7 = 1;
  }
  if (uVar7 == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n",(ulong)in_EDX);
    iVar8 = iVar8 + 1;
  }
  local_38 = max_time(in_RDI,local_30 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VScaleVectorArray");
  }
  N_VConst(0x3fe0000000000000,*puVar4);
  N_VConst(0xc000000000000000,puVar4[1]);
  N_VConst(0xbff0000000000000,puVar4[2]);
  local_58 = 0x4000000000000000;
  local_50 = 0x3fe0000000000000;
  local_48 = 0xc000000000000000;
  dVar6 = get_time();
  iVar1 = N_VScaleVectorArray(3,&local_58,puVar4,uVar5);
  sync_device(in_RDI);
  local_30 = get_time();
  if (iVar1 == 0) {
    iVar2 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)((ulong)uVar7 << 0x20),
                      (sunindextype)dVar6);
    iVar3 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)CONCAT44(iVar2,iVar1),
                      (sunindextype)dVar6);
    iVar3 = iVar3 + iVar2;
    iVar1 = check_ans((sunrealtype)CONCAT44(in_EDX,iVar8),(N_Vector)CONCAT44(iVar3,iVar1),
                      (sunindextype)dVar6);
    iVar1 = iVar1 + iVar3;
  }
  else {
    iVar1 = 1;
  }
  if (iVar1 == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n",(ulong)in_EDX);
    iVar8 = iVar8 + 1;
  }
  local_38 = max_time(in_RDI,local_30 - dVar6);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",local_38,"N_VScaleVectorArray");
  }
  N_VDestroyVectorArray(puVar4,3);
  N_VDestroyVectorArray(uVar5,3);
  return iVar8;
}

Assistant:

int Test_N_VScaleVectorArray(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0, ierr = 0;
  double start_time, stop_time, maxt;

  sunrealtype c[3];
  N_Vector *Y, *Z;

  /* create vectors for testing */
  Y = N_VCloneVectorArray(3, X);
  Z = N_VCloneVectorArray(3, X);

  /*
   * Case 1a: Y[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(1, c, Y, Y);
  sync_device(X);
  stop_time = get_time();

  /* Y[0] should be a vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Y[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 1b: Z[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(1, c, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[0] should be a vector of +1 */
  if (ierr == 0) { failure = check_ans(ONE, Z[0], local_length); }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2a: Y[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(3, c, Y, Y);
  sync_device(X);
  stop_time = get_time();

  /* Y[i] should be a vector of +1, -1, 2 */
  if (ierr == 0)
  {
    failure = check_ans(ONE, Y[0], local_length);
    failure += check_ans(NEG_ONE, Y[1], local_length);
    failure += check_ans(TWO, Y[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2b: Z[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr       = N_VScaleVectorArray(3, c, Y, Z);
  sync_device(X);
  stop_time = get_time();

  /* Z[i] should be a vector of +1, -1, 2 */
  if (ierr == 0)
  {
    failure = check_ans(ONE, Z[0], local_length);
    failure += check_ans(NEG_ONE, Z[1], local_length);
    failure += check_ans(TWO, Z[2], local_length);
  }
  else { failure = 1; }

  if (failure)
  {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0)
  {
    printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Y, 3);
  N_VDestroyVectorArray(Z, 3);

  return (fails);
}